

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O1

void __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::show_stats
          (compact_bonsai_nlm<int,_16UL> *this,ostream *os,int n)

{
  ostream *poVar1;
  string indent;
  char local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)(n << 2));
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"name",4);
  local_49 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"compact_bonsai_nlm",0x12);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"size",4);
  local_49 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"num_ptrs",8);
  local_49 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"alloc_bytes",0xb);
  local_49 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"chunk_size",10);
  local_49 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_bonsai_nlm");
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "num_ptrs", num_ptrs());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "max_length", max_length_);
        show_stat(os, indent, "ave_length", double(sum_length_) / size());
#endif
        show_stat(os, indent, "chunk_size", ChunkSize);
    }